

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase411::run(TestCase411 *this)

{
  undefined8 uVar1;
  ArrayDisposer *pAVar2;
  AsyncIoStream *pAVar3;
  void *pvVar4;
  Disposer *pDVar5;
  long *plVar6;
  Connection CVar7;
  undefined8 *__n;
  void *__buf;
  int in_R8D;
  bool bVar8;
  Client CVar9;
  PipeThread serverThread;
  Response<capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdResults>
  resp;
  TestBootstrapFactory bootstrapFactory;
  AsyncIoContext ioContext;
  TwoPartyClient client;
  undefined1 local_300 [24];
  undefined8 *local_2e8;
  ArrayDisposer *pAStack_2e0;
  undefined8 *local_2d8;
  void *local_2d0;
  undefined8 *local_2c8;
  AsyncIoStream *local_2c0;
  undefined1 local_2b8 [32];
  void *local_298;
  Disposer *pDStack_290;
  RequestHook *local_288;
  Promise<capnp::Response<capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdResults>_>
  local_280;
  void *local_268;
  short local_25c;
  undefined1 local_258 [16];
  long *local_248;
  undefined **local_240;
  char local_238;
  undefined8 *local_230;
  long *local_228;
  undefined8 *local_220;
  long *local_218;
  Side_9fd69ebc87b9719c local_200;
  undefined6 uStack_1fe;
  ArrayDisposer *pAStack_1f8;
  undefined1 local_1f0 [48];
  Disposer *local_1c0;
  Maybe<capnp::MessageSize> local_1b8;
  TwoPartyClient local_1a0;
  
  kj::setupAsyncIo();
  plVar6 = local_218;
  local_240 = &PTR_baseCreateFor_00634b58;
  local_238 = '\0';
  local_1a0.network.super_Connection.super_Connection._vptr_Connection =
       (Connection)operator_new(0x10);
  *(undefined ***)local_1a0.network.super_Connection.super_Connection._vptr_Connection =
       &PTR_operator___00634c70;
  *(undefined ****)((long)local_1a0.network.super_Connection.super_Connection._vptr_Connection + 8)
       = &local_240;
  __n = &kj::_::
         HeapDisposer<kj::Function<void(kj::AsyncIoProvider&,kj::AsyncIoStream&,kj::WaitScope&)>::Impl<capnp::_::(anonymous_namespace)::runAuthenticatingServer(kj::AsyncIoProvider&,capnp::BootstrapFactory<capnp::rpc::twoparty::VatId>&)::$_0>>
         ::instance;
  local_1a0.network.super_TwoPartyVatNetworkBase.super_VatNetworkBase._vptr_VatNetworkBase =
       (VatNetworkBase)
       &kj::_::
        HeapDisposer<kj::Function<void(kj::AsyncIoProvider&,kj::AsyncIoStream&,kj::WaitScope&)>::Impl<capnp::_::(anonymous_namespace)::runAuthenticatingServer(kj::AsyncIoProvider&,capnp::BootstrapFactory<capnp::rpc::twoparty::VatId>&)::$_0>>
        ::instance;
  (**(code **)(*plVar6 + 0x20))(&local_2d8,plVar6);
  CVar7.super_Connection._vptr_Connection =
       local_1a0.network.super_Connection.super_Connection._vptr_Connection;
  if (local_1a0.network.super_Connection.super_Connection._vptr_Connection != (_func_int **)0x0) {
    local_1a0.network.super_Connection.super_Connection._vptr_Connection =
         (Connection)(_func_int **)0x0;
    (**(code **)*(_func_int **)
                 local_1a0.network.super_TwoPartyVatNetworkBase.super_VatNetworkBase.
                 _vptr_VatNetworkBase)
              (local_1a0.network.super_TwoPartyVatNetworkBase.super_VatNetworkBase.
               _vptr_VatNetworkBase,
               (long)CVar7.super_Connection._vptr_Connection +
               *(long *)(*(long *)CVar7.super_Connection._vptr_Connection + -0x10));
  }
  TwoPartyClient::TwoPartyClient(&local_1a0,local_2c0);
  CVar9 = TwoPartyClient::bootstrap((TwoPartyClient *)local_300);
  (**(code **)(*(_func_int **)local_300._8_8_ + 0x20))(&local_200,local_300._8_8_,CVar9.hook.ptr);
  local_2e8 = (undefined8 *)CONCAT62(uStack_1fe,local_200);
  pAStack_2e0 = pAStack_1f8;
  local_300._16_8_ =
       &capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::Client
        ::typeinfo;
  local_1b8.ptr.isSet = false;
  capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::Client::
  getCallerIdRequest((Request<capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdParams,_capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdResults>
                      *)local_1f0,(Client *)(local_300 + 0x10),&local_1b8);
  Request<capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdParams,_capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdResults>
  ::send((Request<capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdParams,_capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdResults>
          *)local_2b8,(int)local_1f0,__buf,(size_t)__n,in_R8D);
  kj::
  Promise<capnp::Response<capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdResults>_>
  ::wait(&local_280,local_2b8);
  pDVar5 = pDStack_290;
  pvVar4 = local_298;
  if (local_298 != (void *)0x0) {
    local_298 = (void *)0x0;
    pDStack_290 = (Disposer *)0x0;
    (**local_288->_vptr_RequestHook)(local_288,pvVar4,8,pDVar5,pDVar5,0);
  }
  uVar1 = local_2b8._24_8_;
  if ((WirePointer *)local_2b8._24_8_ != (WirePointer *)0x0) {
    local_2b8._24_8_ = (WirePointer *)0x0;
    (*(code *)**(undefined8 **)local_2b8._16_8_)
              (local_2b8._16_8_,
               (long)&((WireValue<uint32_t>_conflict *)uVar1)->value +
               *(long *)((long)*(WirePointer *)uVar1 + -0x10));
  }
  uVar1 = local_2b8._8_8_;
  if ((CapTableReader *)local_2b8._8_8_ != (CapTableReader *)0x0) {
    local_2b8._8_8_ = (CapTableReader *)0x0;
    (*(code *)((SegmentReader *)local_2b8._0_8_)->arena->_vptr_Arena)
              (local_2b8._0_8_,
               ((CapTableReader *)uVar1)->_vptr_CapTableReader[-2] +
               (long)&((CapTableReader *)uVar1)->_vptr_CapTableReader);
  }
  pDVar5 = local_1c0;
  if (local_1c0 != (Disposer *)0x0) {
    local_1c0 = (Disposer *)0x0;
    (***(_func_int ***)local_1f0._40_8_)
              (local_1f0._40_8_,pDVar5->_vptr_Disposer[-2] + (long)&pDVar5->_vptr_Disposer);
  }
  pAVar2 = pAStack_2e0;
  if (pAStack_2e0 != (ArrayDisposer *)0x0) {
    pAStack_2e0 = (ArrayDisposer *)0x0;
    (**(code **)*local_2e8)
              (local_2e8,pAVar2->_vptr_ArrayDisposer[-2] + (long)&pAVar2->_vptr_ArrayDisposer);
  }
  uVar1 = local_300._8_8_;
  if ((_func_int **)local_300._8_8_ != (_func_int **)0x0) {
    local_300._8_8_ = (_func_int **)0x0;
    (**(code **)*(_func_int **)local_300._0_8_)
              (local_300._0_8_,uVar1 + *(long *)(*(_func_int **)uVar1 + -0x10));
  }
  local_1f0._8_8_ = local_280.super_PromiseBase.node.ptr;
  local_1f0._16_8_ = local_268;
  local_1f0._0_8_ = local_280.super_PromiseBase.node.disposer;
  local_1f0._24_4_ = local_258._0_4_;
  if (local_25c == 0) {
    local_1f0._8_8_ = (CapTableReader *)0x0;
    local_1f0._16_8_ = (WirePointer *)0x0;
    local_1f0._0_8_ = (SegmentBuilder *)0x0;
    local_1f0._24_4_ = 0x7fffffff;
  }
  PointerReader::getStruct((StructReader *)local_2b8,(PointerReader *)local_1f0,(word *)0x0);
  bVar8 = true;
  if (0xf < (uint)local_298) {
    bVar8 = *(Side_9fd69ebc87b9719c *)local_2b8._16_8_ != CLIENT;
  }
  if ((bVar8) && (kj::_::Debug::minSeverity < 3)) {
    local_300._16_2_ = 1;
    if (local_25c == 0) {
      local_258._0_4_ = 0x7fffffff;
      local_280.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      local_268 = (WirePointer *)0x0;
      local_280.super_PromiseBase.node.disposer = (Disposer *)0x0;
    }
    local_1f0._0_8_ = local_280.super_PromiseBase.node.disposer;
    local_1f0._8_8_ = local_280.super_PromiseBase.node.ptr;
    local_1f0._16_8_ = local_268;
    local_1f0._24_4_ = local_258._0_4_;
    PointerReader::getStruct((StructReader *)local_2b8,(PointerReader *)local_1f0,(word *)0x0);
    if ((uint)local_298 < 0x10) {
      local_200 = SERVER;
    }
    else {
      local_200 = *(Side_9fd69ebc87b9719c *)local_2b8._16_8_;
    }
    kj::_::Debug::
    log<char_const(&)[79],capnp::schemas::Side_9fd69ebc87b9719c,capnp::schemas::Side_9fd69ebc87b9719c>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0x1a2,ERROR,
               "\"failed: expected \" \"(rpc::twoparty::Side::CLIENT) == (resp.getCaller().getSide())\", rpc::twoparty::Side::CLIENT, resp.getCaller().getSide()"
               ,(char (*) [79])
                "failed: expected (rpc::twoparty::Side::CLIENT) == (resp.getCaller().getSide())",
               (Side_9fd69ebc87b9719c *)(local_300 + 0x10),&local_200);
  }
  if ((local_238 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0x1a3,ERROR,"\"failed: expected \" \"bootstrapFactory.called\"",
               (char (*) [41])"failed: expected bootstrapFactory.called");
  }
  plVar6 = local_248;
  if (local_248 != (long *)0x0) {
    local_248 = (long *)0x0;
    (*(code *)**(undefined8 **)local_258._8_8_)
              (local_258._8_8_,(long)plVar6 + *(long *)(*plVar6 + -0x10));
  }
  RpcSystemBase::~RpcSystemBase(&local_1a0.rpcSystem.super_RpcSystemBase);
  TwoPartyVatNetwork::~TwoPartyVatNetwork(&local_1a0.network);
  pAVar3 = local_2c0;
  if (local_2c0 != (AsyncIoStream *)0x0) {
    local_2c0 = (AsyncIoStream *)0x0;
    (**(code **)*local_2c8)
              (local_2c8,
               (pAVar3->super_AsyncInputStream)._vptr_AsyncInputStream[-2] +
               (long)&(pAVar3->super_AsyncInputStream)._vptr_AsyncInputStream);
  }
  if (local_2d0 != (void *)0x0) {
    local_2d0 = (void *)0x0;
    (**(code **)*local_2d8)();
  }
  plVar6 = local_218;
  if (local_218 != (long *)0x0) {
    local_218 = (long *)0x0;
    (**(code **)*local_220)(local_220,(long)plVar6 + *(long *)(*plVar6 + -0x10));
  }
  plVar6 = local_228;
  if (local_228 != (long *)0x0) {
    local_228 = (long *)0x0;
    (**(code **)*local_230)(local_230,(long)plVar6 + *(long *)(*plVar6 + -0x10));
  }
  return;
}

Assistant:

TEST(TwoPartyNetwork, BootstrapFactory) {
  auto ioContext = kj::setupAsyncIo();
  TestBootstrapFactory bootstrapFactory;
  auto serverThread = runAuthenticatingServer(*ioContext.provider, bootstrapFactory);
  TwoPartyClient client(*serverThread.pipe);
  auto resp = client.bootstrap().castAs<test::TestAuthenticatedBootstrap<rpc::twoparty::VatId>>()
      .getCallerIdRequest().send().wait(ioContext.waitScope);
  EXPECT_EQ(rpc::twoparty::Side::CLIENT, resp.getCaller().getSide());
  EXPECT_TRUE(bootstrapFactory.called);
}